

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_default_vfs_open(ma_vfs *pVFS,char *pFilePath,ma_uint32 openMode,ma_vfs_file *pFile)

{
  ma_result mVar1;
  char *pcVar2;
  char *pOpenMode;
  FILE *pFileStd;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pFile != (ma_vfs_file *)0x0) &&
     (*pFile = (ma_vfs_file)0x0, openMode != 0 && pFilePath != (char *)0x0)) {
    pcVar2 = "r+";
    if ((openMode & 2) == 0) {
      pcVar2 = "rb";
    }
    pOpenMode = "wb";
    if ((openMode & 1) != 0) {
      pOpenMode = pcVar2;
    }
    mVar1 = ma_fopen(&pFileStd,pFilePath,pOpenMode);
    if (mVar1 == MA_SUCCESS) {
      *pFile = pFileStd;
    }
  }
  return mVar1;
}

Assistant:

static ma_result ma_default_vfs_open(ma_vfs* pVFS, const char* pFilePath, ma_uint32 openMode, ma_vfs_file* pFile)
{
    if (pFile == NULL) {
        return MA_INVALID_ARGS;
    }

    *pFile = NULL;

    if (pFilePath == NULL || openMode == 0) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_open__win32(pVFS, pFilePath, openMode, pFile);
#else
    return ma_default_vfs_open__stdio(pVFS, pFilePath, openMode, pFile);
#endif
}